

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O1

void Commands::SetX(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,string *set)

{
  pointer pcVar1;
  World *pWVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  string *psVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 extraout_var;
  Character *this;
  Character *pCVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pbVar16;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  mapped_type *pmVar17;
  undefined4 extraout_var_22;
  ulong uVar18;
  uint uVar19;
  size_type *psVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  PacketBuilder builder;
  string title_string;
  undefined1 local_170 [48];
  string *local_140;
  int local_138;
  int local_134;
  key_type local_130;
  size_type *local_110 [2];
  size_type local_100 [2];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar10 = (*from->_vptr_Command_Source[4])(from);
  pbVar16 = (arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (pbVar16->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + pbVar16->_M_string_length);
  this = World::GetCharacter((World *)CONCAT44(extraout_var,iVar10),&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar10 = (*from->_vptr_Command_Source[3])(from);
  pCVar15 = (Character *)CONCAT44(extraout_var_00,iVar10);
  if ((this == (Character *)0x0) || (this->nowhere == true)) {
    iVar10 = (*from->_vptr_Command_Source[4])(from);
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"character_not_found","");
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_01,iVar10) + 0x490),(string *)local_170)
    ;
    (*from->_vptr_Command_Source[5])(from,&local_70);
    local_b0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_001218aa:
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_140 = set;
    iVar10 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar11 = (**from->_vptr_Command_Source)(from);
    if ((this == pCVar15) || ((byte)iVar10 < (byte)iVar11)) {
      if (((pCVar15 == (Character *)0x0) || (this == pCVar15)) ||
         ((pCVar15->nointeract & 0x10) == 0)) {
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
        pbVar16 = (arguments->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0x20 < (ulong)((long)(arguments->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16)) {
          uVar18 = 1;
          lVar22 = 0x28;
          do {
            std::__cxx11::string::_M_append
                      ((char *)local_110,*(ulong *)((long)pbVar16 + lVar22 + -8));
            if (uVar18 < ((long)(arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
              std::__cxx11::string::append((char *)local_110);
            }
            uVar18 = uVar18 + 1;
            pbVar16 = (arguments->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar22 = lVar22 + 0x20;
          } while (uVar18 < (ulong)((long)(arguments->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pbVar16 >> 5));
        }
        psVar9 = local_140;
        iVar10 = std::__cxx11::string::compare((char *)local_140);
        if (iVar10 == 0) {
          iVar11 = util::to_int((arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
          iVar10 = (*from->_vptr_Command_Source[4])(from);
          local_170._0_8_ = local_170 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxLevel","");
          pmVar17 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)(CONCAT44(extraout_var_03,iVar10) + 0x198),(key_type *)local_170
                                );
          iVar14 = util::variant::GetInt(pmVar17);
          iVar10 = 0;
          if (0 < iVar11) {
            iVar10 = iVar11;
          }
          if (iVar14 < iVar10) {
            iVar10 = iVar14;
          }
          this->level = (uchar)iVar10;
LAB_00121da4:
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          bVar23 = true;
LAB_00121dbd:
          bVar8 = 0;
LAB_00122085:
          bVar6 = 0;
LAB_0012208a:
          bVar5 = 0;
LAB_0012208d:
          bVar3 = false;
LAB_0012208f:
          bVar4 = false;
LAB_00122091:
          bVar7 = 0;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxExp","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_05,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->exp = iVar10;
            goto LAB_00121da4;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_06,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->str = iVar10;
LAB_00122069:
            if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
              operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
            }
            bVar8 = 1;
            bVar23 = false;
            goto LAB_00122085;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_07,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->intl = iVar10;
            goto LAB_00122069;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_08,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->wis = iVar10;
            goto LAB_00122069;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_09,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->agi = iVar10;
            goto LAB_00122069;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_10,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->con = iVar10;
            goto LAB_00122069;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxStat","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_11,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->cha = iVar10;
            goto LAB_00122069;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxLevel","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_13,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"StatPerLevel","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_14,iVar10) + 0x198),&local_130);
            iVar12 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar12 * iVar14 < iVar10) {
              iVar10 = iVar12 * iVar14;
            }
            this->statpoints = iVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
              operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
            }
            bVar6 = 1;
            bVar23 = false;
            bVar8 = 0;
            goto LAB_0012208a;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 == 0) {
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxLevel","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_15,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"SkillPerLevel","")
            ;
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_16,iVar10) + 0x198),&local_130);
            iVar12 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar12 * iVar14 < iVar10) {
              iVar10 = iVar12 * iVar14;
            }
            this->skillpoints = iVar10;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
              operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
            }
            bVar5 = 1;
            bVar23 = false;
            bVar8 = 0;
            bVar6 = 0;
            goto LAB_0012208d;
          }
          iVar10 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar10 != 0) {
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 == 0) {
              std::__cxx11::string::_M_assign((string *)&this->title);
              goto LAB_00122a18;
            }
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 == 0) {
              pbVar16 = (arguments->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x21)
              {
                local_170._0_8_ = local_170 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"");
              }
              else {
                local_170._0_8_ = local_170 + 0x10;
                pcVar1 = pbVar16[1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_170,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
              }
              std::__cxx11::string::_M_assign((string *)&this->fiance);
              if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) goto LAB_00122940;
              goto LAB_00122a18;
            }
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 == 0) {
              pbVar16 = (arguments->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x21)
              {
                local_170._0_8_ = local_170 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"");
              }
              else {
                local_170._0_8_ = local_170 + 0x10;
                pcVar1 = pbVar16[1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_170,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
              }
              std::__cxx11::string::_M_assign((string *)&this->partner);
LAB_00122a5c:
              if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
                operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
              }
              bVar23 = false;
              goto LAB_00121dbd;
            }
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 == 0) {
              pbVar16 = (arguments->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x21)
              {
                local_170._0_8_ = local_170 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"");
              }
              else {
                local_170._0_8_ = local_170 + 0x10;
                pcVar1 = pbVar16[1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_170,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
              }
              std::__cxx11::string::_M_assign((string *)&this->home);
              goto LAB_00122a5c;
            }
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 == 0) {
              iVar10 = util::to_int((arguments->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1);
              this->gender = 0 < iVar10;
              bVar4 = true;
              bVar23 = false;
              bVar8 = 0;
              bVar7 = 0;
              bVar6 = 0;
              bVar5 = 0;
              bVar3 = false;
              goto LAB_00122095;
            }
            iVar10 = std::__cxx11::string::compare((char *)psVar9);
            if (iVar10 != 0) {
              iVar10 = std::__cxx11::string::compare((char *)local_140);
              if (iVar10 == 0) {
                iVar11 = util::to_int((arguments->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
                iVar10 = (*from->_vptr_Command_Source[4])(from);
                local_170._0_8_ = local_170 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_170,"MaxHairColor","");
                pmVar17 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)(CONCAT44(extraout_var_20,iVar10) + 0x198),
                                       (key_type *)local_170);
                iVar14 = util::variant::GetInt(pmVar17);
                iVar10 = 0;
                if (0 < iVar11) {
                  iVar10 = iVar11;
                }
                if (iVar14 < iVar10) {
                  iVar10 = iVar14;
                }
                this->haircolor = (uchar)iVar10;
                goto LAB_00122bcc;
              }
              iVar10 = std::__cxx11::string::compare((char *)local_140);
              if (iVar10 == 0) {
                iVar11 = util::to_int((arguments->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
                iVar10 = (*from->_vptr_Command_Source[4])(from);
                local_170._0_8_ = local_170 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxSkin","");
                pmVar17 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)(CONCAT44(extraout_var_21,iVar10) + 0x198),
                                       (key_type *)local_170);
                iVar14 = util::variant::GetInt(pmVar17);
                iVar10 = 0;
                if (0 < iVar11) {
                  iVar10 = iVar11;
                }
                if (iVar14 < iVar10) {
                  iVar10 = iVar14;
                }
                this->race = (Skin)iVar10;
                goto LAB_00122bcc;
              }
              iVar10 = std::__cxx11::string::compare((char *)local_140);
              if (iVar10 == 0) {
                iVar10 = util::to_int((arguments->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                iVar11 = 9;
                if (iVar10 < 9) {
                  iVar11 = iVar10;
                }
                this->guild_rank = (uchar)iVar11;
                goto LAB_00122a18;
              }
              iVar10 = std::__cxx11::string::compare((char *)local_140);
              if (iVar10 == 0) {
                iVar10 = util::to_int((arguments->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                if (1999 < iVar10) {
                  iVar10 = 2000;
                }
                this->karma = iVar10;
                bVar7 = 1;
                bVar8 = 0;
                goto LAB_00122a1d;
              }
              iVar10 = std::__cxx11::string::compare((char *)local_140);
              if (iVar10 == 0) {
                iVar10 = util::to_int((arguments->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
                iVar11 = (*from->_vptr_Command_Source[4])(from);
                lVar22 = *(long *)(CONCAT44(extraout_var_22,iVar11) + 0x178);
                iVar11 = (int)((ulong)(*(long *)(lVar22 + 0x10) - *(long *)(lVar22 + 8)) >> 3) *
                         -0x49249249 + -1;
                if (iVar10 < 1) {
                  iVar10 = 0;
                }
                if (iVar11 < iVar10) {
                  iVar10 = iVar11;
                }
                this->clas = (uchar)iVar10;
                bVar8 = 1;
                goto LAB_00122a1b;
              }
              bVar3 = true;
              bVar23 = false;
              bVar8 = 0;
              bVar6 = 0;
              bVar5 = 0;
              goto LAB_0012208f;
            }
            iVar11 = util::to_int((arguments->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = local_170 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"MaxHairStyle","");
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(CONCAT44(extraout_var_19,iVar10) + 0x198),
                                   (key_type *)local_170);
            iVar14 = util::variant::GetInt(pmVar17);
            iVar10 = 0;
            if (0 < iVar11) {
              iVar10 = iVar11;
            }
            if (iVar14 < iVar10) {
              iVar10 = iVar14;
            }
            this->hairstyle = (uchar)iVar10;
LAB_00122bcc:
            if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
              operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
            }
            bVar4 = true;
            bVar23 = false;
            bVar8 = 0;
            bVar6 = 0;
            bVar5 = 0;
            bVar3 = false;
            goto LAB_00122091;
          }
          pWVar2 = this->world;
          psVar20 = (size_type *)(local_170 + 0x10);
          local_170._0_8_ = psVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"NoInteractDefaultAdmin","");
          pmVar17 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->config,(key_type *)local_170);
          local_134 = util::variant::GetInt(pmVar17);
          if ((size_type *)local_170._0_8_ != psVar20) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          pWVar2 = this->world;
          local_170._0_8_ = psVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170,"NoInteractDefault","");
          pmVar17 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->config,(key_type *)local_170);
          iVar10 = util::variant::GetInt(pmVar17);
          local_140 = (string *)CONCAT44(local_140._4_4_,iVar10);
          if ((size_type *)local_170._0_8_ != psVar20) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          pWVar2 = this->world;
          local_170._0_8_ = psVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"hide","");
          pmVar17 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->admin_config,(key_type *)local_170);
          local_138 = util::variant::GetInt(pmVar17);
          if ((size_type *)local_170._0_8_ != psVar20) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
          uVar13 = util::to_int((arguments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
          uVar19 = 4;
          if ((byte)uVar13 < 4) {
            uVar19 = uVar13;
          }
          uVar21 = uVar19 & 0xff;
          if ((int)local_140 == 0) {
            bVar23 = false;
          }
          else {
            bVar23 = false;
            if ((local_134 <= (int)(uint)this->admin) && (bVar23 = false, (int)uVar21 < local_134))
            {
              bVar23 = (this->nointeract & 1) == 0;
            }
          }
          iVar10 = (**from->_vptr_Command_Source)(from);
          if (((AdminLevel)iVar10 <= (AdminLevel)uVar19) ||
             (iVar10 = (*from->_vptr_Command_Source[3])(from),
             (bool)(this == (Character *)CONCAT44(extraout_var_17,iVar10) | bVar23))) {
            iVar10 = (*from->_vptr_Command_Source[4])(from);
            local_170._0_8_ = psVar20;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,"command_access_denied","");
            I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_18,iVar10) + 0x490),
                           (string *)local_170);
            (*from->_vptr_Command_Source[5])(from,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((size_type *)local_170._0_8_ != psVar20) {
LAB_00122940:
              operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
            }
          }
          else {
            if ((((int)(uint)this->admin < local_134) && (local_134 <= (int)uVar21)) &&
               ((this->nointeract & 1) == 0)) {
              this->nointeract = (int)local_140;
            }
            if ((local_138 <= (int)(uint)this->admin) && ((int)uVar21 < local_138)) {
              Character::Unhide(this,0x1f);
            }
            if ((byte)uVar13 == 0) {
              iVar10 = -1;
              if (this->admin != ADMIN_PLAYER) goto LAB_001229f8;
            }
            else if (this->admin == ADMIN_PLAYER) {
              iVar10 = 1;
LAB_001229f8:
              World::UpdateAdminCount(this->world,iVar10 + this->world->admin_count);
            }
            this->admin = (AdminLevel)uVar19;
          }
LAB_00122a18:
          bVar8 = 0;
LAB_00122a1b:
          bVar7 = 0;
LAB_00122a1d:
          bVar23 = false;
          bVar6 = 0;
          bVar5 = 0;
          bVar3 = false;
          bVar4 = false;
        }
LAB_00122095:
        if (bVar3) {
          iVar10 = (*from->_vptr_Command_Source[4])(from);
          local_170._0_8_ = local_170 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"invalid_setx","");
          I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_12,iVar10) + 0x490),
                         (string *)local_170);
          (*from->_vptr_Command_Source[5])(from,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
          }
        }
        else {
          if (bVar4) {
            Character::Warp(this,this->map->id,this->x,this->y,WARP_ANIMATION_NONE);
          }
          if ((bool)(bVar6 | bVar5)) {
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)local_170,PACKET_RECOVER,PACKET_TARGET_GROUP,10);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->statpoints);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->skillpoints);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxsp);
            Character::Send(this,(PacketBuilder *)local_170);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_170);
          }
          if ((bool)(bVar8 | bVar23)) {
            Character::CalculateStats(this,true);
            PacketBuilder::PacketBuilder((PacketBuilder *)local_170,PACKET_RECOVER,PACKET_LIST,0x20)
            ;
            PacketBuilder::AddShort((PacketBuilder *)local_170,(uint)this->clas);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_str);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_intl);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_wis);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_agi);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_con);
            PacketBuilder::AddShort((PacketBuilder *)local_170,*this->display_cha);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxsp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxweight);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->mindam);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->maxdam);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->accuracy);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->evade);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->armor);
            Character::Send(this,(PacketBuilder *)local_170);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_170);
          }
          if ((bool)(bVar7 | bVar23)) {
            PacketBuilder::PacketBuilder((PacketBuilder *)local_170,PACKET_RECOVER,PACKET_REPLY,0xb)
            ;
            PacketBuilder::AddInt((PacketBuilder *)local_170,this->exp);
            PacketBuilder::AddShort((PacketBuilder *)local_170,this->karma);
            uVar19 = 0;
            if (bVar23) {
              uVar19 = (uint)this->level;
            }
            PacketBuilder::AddChar((PacketBuilder *)local_170,uVar19);
            if (bVar23) {
              PacketBuilder::AddShort((PacketBuilder *)local_170,this->statpoints);
              PacketBuilder::AddShort((PacketBuilder *)local_170,this->skillpoints);
            }
            Character::Send(this,(PacketBuilder *)local_170);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_170);
          }
          Character::CheckQuestRules(this);
        }
        local_170._16_8_ = local_100[0];
        psVar20 = local_110[0];
        if (local_110[0] == local_100) {
          return;
        }
        goto LAB_001218c1;
      }
      iVar10 = (*from->_vptr_Command_Source[4])(from);
      local_170._0_8_ = local_170 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"command_access_denied","");
      I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_04,iVar10) + 0x490),
                     (string *)local_170);
      (*from->_vptr_Command_Source[5])(from,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001218aa;
    }
    else {
      iVar10 = (*from->_vptr_Command_Source[4])(from);
      local_170._0_8_ = local_170 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"command_access_denied","");
      I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_02,iVar10) + 0x490),
                     (string *)local_170);
      (*from->_vptr_Command_Source[5])(from,&local_90);
      local_b0.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_001218aa;
    }
  }
  psVar20 = (size_type *)local_170._0_8_;
  if ((undefined1 *)local_170._0_8_ == local_170 + 0x10) {
    return;
  }
LAB_001218c1:
  operator_delete(psVar20,local_170._16_8_ + 1);
  return;
}

Assistant:

void SetX(const std::vector<std::string>& arguments, Command_Source* from, std::string set)
{
	Character *victim = from->SourceWorld()->GetCharacter(arguments[0]);
	Character *from_character = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
	}
	else if (victim->SourceAccess() >= from->SourceAccess() && victim != from_character)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else if (from_character && from_character != victim && !from_character->CanInteractCharMod())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else
	{
		std::string title_string = "";

		for (std::size_t i = 1; i < arguments.size(); ++i)
		{
			title_string += arguments[i];

			if (i < arguments.size() - 1)
				title_string += " ";
		}

		bool appearance = false;
		bool failure = false;
		bool level = false;
		bool stats = false;
		bool karma = false;

		bool statpoints = false;
		bool skillpoints = false;

			 if (set == "level") (level = true, victim->level) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]));
		else if (set == "exp") (level = true, victim->exp) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxExp"]));
		else if (set == "str") (stats = true, victim->str) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "int") (stats = true, victim->intl) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "wis") (stats = true, victim->wis) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "agi") (stats = true, victim->agi) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "con") (stats = true, victim->con) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "cha") (stats = true, victim->cha) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "statpoints") (statpoints = true, victim->statpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["StatPerLevel"]));
		else if (set == "skillpoints") (skillpoints = true, victim->skillpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["SkillPerLevel"]));
		else if (set == "admin")
		{
			int no_interact_default_admin = victim->world->config["NoInteractDefaultAdmin"];
			int no_interact_default = victim->world->config["NoInteractDefault"];
			int hide_level = victim->world->admin_config["hide"];

			AdminLevel level = std::min(std::max(AdminLevel(util::to_int(arguments[1])), ADMIN_PLAYER), ADMIN_HGM);

			// Avoid granting a player more privilege by lowering their admin level
			bool would_privilege = (no_interact_default != 0) && (victim->admin >= no_interact_default_admin)
			                    && (level < no_interact_default_admin) && !(victim->nointeract & Character::NoInteractCustom);

			if (level < from->SourceAccess() && victim != from->SourceCharacter() && !would_privilege)
			{
				if (victim->admin < no_interact_default_admin && level >= no_interact_default_admin
				 && !(victim->nointeract & Character::NoInteractCustom))
				{
					victim->nointeract = no_interact_default;
				}

				if (victim->admin >= hide_level && level < hide_level)
					victim->Unhide(Character::HideAll);

				if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
					victim->world->DecAdminCount();
				else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
					victim->world->IncAdminCount();

				victim->admin = level;
			}
			else
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
			}
		}
		else if (set == "title") victim->title = title_string;
		else if (set == "fiance") victim->fiance = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "partner") victim->partner = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "home") victim->home = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "gender") (appearance = true, victim->gender) = Gender(std::min(std::max(util::to_int(arguments[1]), 0), 1));
		else if (set == "hairstyle") (appearance = true, victim->hairstyle) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairStyle"]));
		else if (set == "haircolor") (appearance = true, victim->haircolor) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairColor"]));
		else if (set == "race") (appearance = true, victim->race) = Skin(std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxSkin"])));
		else if (set == "guildrank") victim->guild_rank = std::min(std::max(util::to_int(arguments[1]), 0), 9);
		else if (set == "karma") (karma = true, victim->karma) = std::min(std::max(util::to_int(arguments[1]), 0), 2000);
		else if (set == "class") (stats = true, victim->clas) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->ecf->data.size() - 1));
		else failure = true;

		if (failure)
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_setx"));
		}
		else
		{
			// Easiest way to get the character to update on everyone nearby's screen
			if (appearance)
				victim->Warp(victim->map->id, victim->x, victim->y);

			if (statpoints || skillpoints)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_TARGET_GROUP, 10);
				builder.AddShort(victim->statpoints);
				builder.AddShort(victim->skillpoints);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				victim->Send(builder);
			}

			if (level || stats)
			{
				victim->CalculateStats();

				PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);
				builder.AddShort(victim->clas);
				builder.AddShort(victim->display_str);
				builder.AddShort(victim->display_intl);
				builder.AddShort(victim->display_wis);
				builder.AddShort(victim->display_agi);
				builder.AddShort(victim->display_con);
				builder.AddShort(victim->display_cha);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				builder.AddShort(victim->maxweight);
				builder.AddShort(victim->mindam);
				builder.AddShort(victim->maxdam);
				builder.AddShort(victim->accuracy);
				builder.AddShort(victim->evade);
				builder.AddShort(victim->armor);
				victim->Send(builder);
			}

			if (karma || level)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
				builder.AddInt(victim->exp);
				builder.AddShort(victim->karma);
				builder.AddChar(level ? victim->level : 0);
				if (level)
				{
					builder.AddShort(victim->statpoints);
					builder.AddShort(victim->skillpoints);
				}
				victim->Send(builder);
			}

			victim->CheckQuestRules();
		}
	}
}